

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O1

char * T_CString_toUpperCase_63(char *str)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  char *origPtr;
  
  pcVar2 = str;
  if (str != (char *)0x0) {
    do {
      cVar1 = *str;
      cVar3 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar3 = cVar1;
      }
      *str = cVar3;
      str = str + 1;
    } while (cVar3 != '\0');
  }
  return pcVar2;
}

Assistant:

U_CAPI char* U_EXPORT2
T_CString_toUpperCase(char* str)
{
    char* origPtr = str;

    if (str) {
        do
            *str = (char)uprv_toupper(*str);
        while (*(str++));
    }

    return origPtr;
}